

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

lys_module * lyd_data_next_module(lyd_node **next,lyd_node **first)

{
  lys_module *plVar1;
  lys_module *mod;
  lyd_node **first_local;
  lyd_node **next_local;
  
  if (*next == (lyd_node *)0x0) {
    *first = (lyd_node *)0x0;
    next_local = (lyd_node **)0x0;
  }
  else {
    *first = *next;
    next_local = (lyd_node **)lyd_owner_module(*next);
    *next = *next;
    while ((*next != (lyd_node *)0x0 &&
           (plVar1 = lyd_owner_module(*next), plVar1 == (lys_module *)next_local))) {
      *next = (*next)->next;
    }
  }
  return (lys_module *)next_local;
}

Assistant:

const struct lys_module *
lyd_data_next_module(struct lyd_node **next, struct lyd_node **first)
{
    const struct lys_module *mod;

    if (!*next) {
        /* all data traversed */
        *first = NULL;
        return NULL;
    }

    *first = *next;

    /* prepare next */
    mod = lyd_owner_module(*next);
    LY_LIST_FOR(*next, *next) {
        if (lyd_owner_module(*next) != mod) {
            break;
        }
    }

    return mod;
}